

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

QSize __thiscall QSplitterHandle::sizeHint(QSplitterHandle *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  QStyle *pQVar4;
  QSize QVar5;
  long in_FS_OFFSET;
  int local_70;
  int local_6c;
  QStyleOption opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  iVar3 = QSplitter::handleWidth(*(QSplitter **)(lVar2 + 600));
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,0,0);
  QStyleOption::initFrom(&opt,*(QWidget **)(lVar2 + 600));
  opt._8_8_ = opt._8_8_ & 0xffffffff00000000;
  pQVar4 = QWidget::style(*(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10));
  local_70 = iVar3;
  local_6c = iVar3;
  QVar5 = (QSize)(**(code **)(*(long *)pQVar4 + 0xe8))
                           (pQVar4,5,&opt,&local_70,*(undefined8 *)(lVar2 + 600));
  QStyleOption::~QStyleOption(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSize QSplitterHandle::sizeHint() const
{
    Q_D(const QSplitterHandle);
    int hw = d->s->handleWidth();
    QStyleOption opt(0);
    opt.initFrom(d->s);
    opt.state = QStyle::State_None;
    return parentWidget()->style()->sizeFromContents(QStyle::CT_Splitter, &opt, QSize(hw, hw), d->s);
}